

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.c
# Opt level: O0

piga_event_queue *
piga_event_queue_create_default_in_shm
          (int *shm_id,piga_status *status,piga_event_queue *host_queue,char *name,int name_length)

{
  int shm_key_00;
  piga_event_queue *ppVar1;
  piga_event *ev_00;
  piga_event_consumer_registered *ev_01;
  piga_event_consumer_registered *consumer_registered;
  piga_event *ev;
  piga_event_queue *queue;
  int shm_key;
  int name_length_local;
  char *name_local;
  piga_event_queue *host_queue_local;
  piga_status *status_local;
  int *shm_id_local;
  
  shm_key_00 = piga_event_queue_get_default_process_shm_key();
  ppVar1 = piga_event_queue_create_in_shm(shm_key_00,shm_id,status);
  if (*status == PIGA_STATUS_OK) {
    ev_00 = piga_event_create();
    piga_event_set_type(ev_00,PIGA_EVENT_CONSUMER_REGISTERED);
    ev_01 = piga_event_get_consumer_registered(ev_00);
    piga_event_consumer_registered_set_shm_key(ev_01,shm_key_00);
    piga_event_consumer_registered_set_name(ev_01,name,name_length);
    piga_event_queue_push(host_queue,ev_00);
    piga_event_free(ev_00);
  }
  return ppVar1;
}

Assistant:

piga_event_queue* piga_event_queue_create_default_in_shm(int* shm_id, piga_status* status, piga_event_queue *host_queue, const char *name, int name_length)
{
    int shm_key = piga_event_queue_get_default_process_shm_key();
    
    piga_event_queue *queue = piga_event_queue_create_in_shm(
        shm_key,
        shm_id,
        status
    );
    
    if(*status == PIGA_STATUS_OK) {
        piga_event *ev = piga_event_create();
        
        piga_event_set_type(ev, PIGA_EVENT_CONSUMER_REGISTERED);
        
        piga_event_consumer_registered *consumer_registered = piga_event_get_consumer_registered(ev);
        piga_event_consumer_registered_set_shm_key(consumer_registered, shm_key);
        piga_event_consumer_registered_set_name(consumer_registered, name, name_length);
        
        piga_event_queue_push(host_queue, ev);
        
        piga_event_free(ev);
    }
    
    return queue;
}